

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ColumnList * duckdb::Parser::ParseColumnList(string *column_list,ParserOptions options)

{
  ParserOptions options_p;
  size_type sVar1;
  pointer pSVar2;
  undefined8 uVar3;
  pointer pCVar4;
  ColumnList *in_RDI;
  ColumnList *in_stack_00000008;
  ColumnList *in_stack_00000010;
  CreateTableInfo *info;
  CreateStatement *create;
  Parser parser;
  string mock_query;
  string *in_stack_00000368;
  Parser *in_stack_00000370;
  char *in_stack_fffffffffffffe60;
  ColumnList *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  vector<duckdb::ParserExtension,_true> *in_stack_fffffffffffffe80;
  SQLStatement *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  allocator aStack_f9;
  string asStack_f8 [32];
  CreateStatement *pCStack_d8;
  undefined1 uStack_ca;
  allocator aStack_c9;
  string asStack_c8 [56];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  avStack_90 [2];
  string asStack_50 [32];
  string asStack_30 [48];
  
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_fffffffffffffea8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  ::std::__cxx11::string::~string(asStack_50);
  options_p.max_expression_depth = in_stack_fffffffffffffe78;
  options_p.preserve_identifier_case = (bool)(char)in_stack_fffffffffffffe70;
  options_p.integer_division = (bool)(char)((ulong)in_stack_fffffffffffffe70 >> 8);
  options_p._2_6_ = (int6)((ulong)in_stack_fffffffffffffe70 >> 0x10);
  options_p.extensions = in_stack_fffffffffffffe80;
  Parser((Parser *)in_stack_00000010,options_p);
  ParseQuery(in_stack_00000370,in_stack_00000368);
  sVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
          ::size(avStack_90);
  this = in_stack_00000010;
  if (sVar1 == 1) {
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                  *)in_stack_00000010,(size_type)in_stack_00000008);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)in_stack_00000010);
    this = in_stack_00000010;
    if (pSVar2->type == CREATE_STATEMENT) {
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                    *)in_stack_00000010,(size_type)in_stack_00000008);
      unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::operator->
                ((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)in_stack_00000010);
      pCStack_d8 = SQLStatement::Cast<duckdb::CreateStatement>(in_stack_fffffffffffffea0);
      pCVar4 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)in_stack_00000010);
      if ((pCVar4->super_ParseInfo).field_0x9 != '\x01') {
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (asStack_f8,"Expected a single CREATE TABLE statement",&aStack_f9);
        InternalException::InternalException
                  ((InternalException *)in_stack_00000010,(string *)in_stack_00000008);
        __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
      }
      unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 in_stack_00000010);
      ParseInfo::Cast<duckdb::CreateTableInfo>((ParseInfo *)in_stack_00000010);
      ColumnList::ColumnList(in_stack_00000010,in_stack_00000008);
      ~Parser((Parser *)0x2a2298d);
      ::std::__cxx11::string::~string(asStack_30);
      return in_RDI;
    }
  }
  uStack_ca = 1;
  uVar3 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_c8,"Expected a single CREATE statement",&aStack_c9);
  ParserException::ParserException((ParserException *)this,(string *)in_stack_00000008);
  uStack_ca = 0;
  __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

ColumnList Parser::ParseColumnList(const string &column_list, ParserOptions options) {
	string mock_query = "CREATE TABLE tbl (" + column_list + ")";
	Parser parser(options);
	parser.ParseQuery(mock_query);
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::CREATE_STATEMENT) {
		throw ParserException("Expected a single CREATE statement");
	}
	auto &create = parser.statements[0]->Cast<CreateStatement>();
	if (create.info->type != CatalogType::TABLE_ENTRY) {
		throw InternalException("Expected a single CREATE TABLE statement");
	}
	auto &info = create.info->Cast<CreateTableInfo>();
	return std::move(info.columns);
}